

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_TextObject::GetBBox
          (ON_OBSOLETE_V5_TextObject *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  int iVar1;
  ON_2dPoint *pOVar2;
  bool bVar3;
  undefined3 in_register_00000009;
  byte bVar4;
  ON_3dPoint *__return_storage_ptr__;
  ON_BoundingBox local_78;
  ON_3dPoint local_40;
  
  ON_BoundingBox::ON_BoundingBox(&local_78);
  if (CONCAT31(in_register_00000009,bGrowBox) == 0) {
LAB_004aa931:
    bVar4 = 0;
  }
  else {
    local_78.m_min.x = *boxmin;
    local_78.m_min.y = boxmin[1];
    local_78.m_min.z = boxmin[2];
    local_78.m_max.x = *boxmax;
    local_78.m_max.y = boxmax[1];
    local_78.m_max.z = boxmax[2];
    bVar3 = ON_BoundingBox::IsValid(&local_78);
    bVar4 = 1;
    if (!bVar3) {
      ON_BoundingBox::Destroy(&local_78);
      goto LAB_004aa931;
    }
  }
  iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (iVar1 == 0) {
    __return_storage_ptr__ = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin;
  }
  else {
    if (iVar1 != 1) {
      if (bVar4 == 0) {
        return false;
      }
      goto LAB_004aa986;
    }
    pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    __return_storage_ptr__ = &local_40;
    ON_Plane::PointAt(__return_storage_ptr__,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,
                      pOVar2->x,pOVar2->y);
  }
  ON_BoundingBox::Set(&local_78,__return_storage_ptr__,(uint)bVar4);
LAB_004aa986:
  *boxmin = local_78.m_min.x;
  boxmin[1] = local_78.m_min.y;
  boxmin[2] = local_78.m_min.z;
  *boxmax = local_78.m_max.x;
  boxmax[1] = local_78.m_max.y;
  boxmax[2] = local_78.m_max.z;
  return true;
}

Assistant:

bool ON_OBSOLETE_V5_TextObject::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  ON_BoundingBox bbox;
  if ( bGrowBox )
  {
    bbox.m_min.x = boxmin[0]; 
    bbox.m_min.y = boxmin[1]; 
    bbox.m_min.z = boxmin[2];
    bbox.m_max.x = boxmax[0]; 
    bbox.m_max.y = boxmax[1]; 
    bbox.m_max.z = boxmax[2];
    if ( !bbox.IsValid() )
    {
      bbox.Destroy();
      bGrowBox = false;
    }
  }

  if ( 1 == m_points.Count() )
  {
    ON_2dPoint uv = m_points[0];
    bbox.Set( m_plane.PointAt(uv.x,uv.y), bGrowBox );
    bGrowBox = true;
  }
  else if ( 0 == m_points.Count() )
  {
    bbox.Set( m_plane.origin, bGrowBox );
    bGrowBox = true;
  }

  if ( bGrowBox )
  {
    boxmin[0] = bbox.m_min.x; 
    boxmin[1] = bbox.m_min.y; 
    boxmin[2] = bbox.m_min.z; 
    boxmax[0] = bbox.m_max.x; 
    boxmax[1] = bbox.m_max.y; 
    boxmax[2] = bbox.m_max.z; 
  }

  return bGrowBox;
}